

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O2

CoeffReturnType __thiscall
Eigen::internal::
product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2,_-1,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
::coeff(product_evaluator<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        *this,Index index)

{
  Scalar SVar1;
  BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true,_true>
  local_1a8;
  PointerType local_178 [2];
  non_const_type local_168;
  undefined8 uStack_160;
  long local_158;
  Index IStack_150;
  undefined1 local_148 [160];
  Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true>
  local_a8;
  
  BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true,_true>
  ::BlockImpl_dense(&local_1a8,&this->m_lhs,0);
  Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2,_-1,_false>,_2,_1,_true>
  ::Block(&local_a8,&this->m_rhs,index);
  local_158 = local_1a8.m_startCol.m_value;
  IStack_150 = local_1a8.m_outerStride;
  local_168 = local_1a8.m_xpr.m_matrix;
  uStack_160 = local_1a8._24_8_;
  local_178[0] = local_1a8.
                 super_MapBase<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>,_0>
                 .m_data;
  local_178[1] = (PointerType)
                 local_1a8.
                 super_MapBase<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>,_0>
                 ._8_8_;
  memcpy(local_148,&local_a8,0x90);
  SVar1 = DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2,_-1,_false>,_2,_1,_true>_>_>
          ::sum((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true>_>_>
                 *)local_178);
  return SVar1;
}

Assistant:

const CoeffReturnType coeff(Index index) const
  {
    const Index row = (RowsAtCompileTime == 1 || MaxRowsAtCompileTime==1) ? 0 : index;
    const Index col = (RowsAtCompileTime == 1 || MaxRowsAtCompileTime==1) ? index : 0;
    return (m_lhs.row(row).transpose().cwiseProduct( m_rhs.col(col) )).sum();
  }